

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::visitBlock(FunctionValidator *this,Block *curr)

{
  IRProfile IVar1;
  char *__code;
  undefined8 *puVar2;
  bool bVar3;
  __node_base_ptr p_Var4;
  _Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
  __it;
  
  if (((((this->
         super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
         ).super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
         super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
        currModule)->features).features & 0x200) == 0) {
    bVar3 = wasm::Type::isTuple(&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).
                                 super_Expression.type);
    ValidationInfo::shouldBeTrue<wasm::Block*>
              (this->info,!bVar3,curr,
               "Multivalue block type require multivalue [--enable-multivalue]",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
  }
  if ((curr->name).super_IString.str._M_str != (char *)0x0) {
    noteLabelName(this,(Name)(curr->name).super_IString.str);
    __code = (curr->name).super_IString.str._M_str;
    __it._M_cur = (__node_type *)0x0;
    p_Var4 = std::
             _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->breakTypes)._M_h,
                        (ulong)__code % (this->breakTypes)._M_h._M_bucket_count,&curr->name,
                        (__hash_code)__code);
    if (p_Var4 != (__node_base_ptr)0x0) {
      __it._M_cur = (__node_type *)p_Var4->_M_nxt;
    }
    if (__it._M_cur == (__node_type *)0x0) {
      __assert_fail("iter != breakTypes.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                    ,0x278,"void wasm::FunctionValidator::visitBlock(Block *)");
    }
    for (puVar2 = *(undefined8 **)((long)__it._M_cur + 0x28); puVar2 != (undefined8 *)0x0;
        puVar2 = (undefined8 *)*puVar2) {
      shouldBeSubType(this,(Type)puVar2[1],
                      (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)1>).
                            super_Expression.type.id,(Expression *)curr,
                      "break type must be a subtype of the target block type");
    }
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::erase(&(this->breakTypes)._M_h,(const_iterator)__it._M_cur);
  }
  IVar1 = ((this->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
           ).
           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
          currFunction)->profile;
  if (IVar1 == Poppy) {
    validatePoppyBlockElements(this,curr);
    return;
  }
  if (IVar1 == Normal) {
    validateNormalBlockElements(this,curr);
    return;
  }
  return;
}

Assistant:

void FunctionValidator::visitBlock(Block* curr) {
  if (!getModule()->features.hasMultivalue()) {
    shouldBeTrue(
      !curr->type.isTuple(),
      curr,
      "Multivalue block type require multivalue [--enable-multivalue]");
  }
  // if we are break'ed to, then the value must be right for us
  if (curr->name.is()) {
    noteLabelName(curr->name);
    auto iter = breakTypes.find(curr->name);
    assert(iter != breakTypes.end()); // we set it ourselves
    for (Type breakType : iter->second) {
      // none or unreachable means a poison value that we should ignore - if
      // consumed, it will error
      shouldBeSubType(breakType,
                      curr->type,
                      curr,
                      "break type must be a subtype of the target block type");
    }
    breakTypes.erase(iter);
  }
  switch (getFunction()->profile) {
    case IRProfile::Normal:
      validateNormalBlockElements(curr);
      break;
    case IRProfile::Poppy:
      validatePoppyBlockElements(curr);
      break;
  }
}